

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.h
# Opt level: O0

void __thiscall jsonnet::internal::anon_unknown_0::HeapString::~HeapString(HeapString *this)

{
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&PTR__HeapString_003a1578;
  std::__cxx11::u32string::~u32string(in_RDI);
  HeapEntity::~HeapEntity((HeapEntity *)in_RDI);
  return;
}

Assistant:

HeapString(const UString &value) : HeapEntity(STRING), value(value) {}